

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::recordBufferQueryPreciseWithFlagTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 dVar1;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *this;
  allocator<char> local_1c9;
  RefBase<vk::VkCommandBuffer_s_*> local_1c8;
  RefBase<vk::Handle<(vk::HandleType)11>_> local_1a8;
  RefBase<vk::VkCommandBuffer_s_*> local_188;
  string local_168;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_148;
  VkCommandBufferBeginInfo secBufferBeginInfo;
  VkCommandBufferBeginInfo primBufferBeginInfo;
  undefined1 local_e8 [24];
  VkCommandPool VStack_d0;
  VkFramebuffer local_c8;
  undefined8 local_c0;
  VkQueryPipelineStatisticFlags local_b8;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  VkCommandBufferAllocateInfo secCmdBufParams;
  VkCommandBufferAllocateInfo primCmdBufParams;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  pVVar3 = Context::getDeviceFeatures(context);
  if (pVVar3->inheritedQueries != 0) {
    cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    cmdPoolParams.pNext = (void *)0x0;
    cmdPoolParams.flags = 2;
    cmdPoolParams.queueFamilyIndex = dVar1;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_e8,vk,device,&cmdPoolParams,
               (VkAllocationCallbacks *)0x0);
    local_148.m_data.deleter.m_device = (VkDevice)local_e8._16_8_;
    local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_d0.m_internal;
    local_148.m_data.object.m_internal = local_e8._0_8_;
    local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
    local_e8._0_8_ = 0;
    local_e8._8_8_ = (DeviceInterface *)0x0;
    local_e8._16_8_ = (VkDevice)0x0;
    VStack_d0.m_internal = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_e8);
    primCmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    primCmdBufParams.pNext = (void *)0x0;
    primCmdBufParams.commandPool.m_internal = local_148.m_data.object.m_internal;
    primCmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    primCmdBufParams.commandBufferCount = 1;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_e8,vk,device,&primCmdBufParams);
    local_1c8.m_data.deleter.m_device = (VkDevice)local_e8._16_8_;
    local_1c8.m_data.deleter.m_pool.m_internal = VStack_d0.m_internal;
    local_1c8.m_data.object = (VkCommandBuffer_s *)local_e8._0_8_;
    local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
    local_e8._0_8_ = 0;
    local_e8._8_8_ = (DeviceInterface *)0x0;
    local_e8._16_8_ = (VkDevice)0x0;
    VStack_d0.m_internal = 0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)local_e8);
    secCmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    secCmdBufParams.pNext = (void *)0x0;
    secCmdBufParams.commandPool.m_internal = local_148.m_data.object.m_internal;
    secCmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_SECONDARY;
    secCmdBufParams.commandBufferCount = 1;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_e8,vk,device,&secCmdBufParams);
    local_188.m_data.deleter.m_device = (VkDevice)local_e8._16_8_;
    local_188.m_data.deleter.m_pool.m_internal = VStack_d0.m_internal;
    local_188.m_data.object = (VkCommandBuffer_s *)local_e8._0_8_;
    local_188.m_data.deleter.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
    local_e8._0_8_ = 0;
    local_e8._8_8_ = (DeviceInterface *)0x0;
    local_e8._16_8_ = (VkDevice)0x0;
    VStack_d0.m_internal = 0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)local_e8);
    local_e8._0_4_ = 0x29;
    local_c8.m_internal = 0;
    local_e8._8_8_ = (DeviceInterface *)0x0;
    local_e8._16_8_ = (VkDevice)0x0;
    VStack_d0.m_internal = VStack_d0.m_internal & 0xffffffff00000000;
    local_c0._0_4_ = 1;
    local_c0._4_4_ = 1;
    local_b8 = 0;
    secBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    secBufferBeginInfo.pNext = (void *)0x0;
    primBufferBeginInfo.flags = 0;
    primBufferBeginInfo._20_4_ = 0;
    primBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
    secBufferBeginInfo.flags = 0;
    primBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    primBufferBeginInfo._4_4_ = 0;
    primBufferBeginInfo.pNext = (void *)0x0;
    queryPoolCreateInfo.flags = 0;
    queryPoolCreateInfo.queryType = VK_QUERY_TYPE_OCCLUSION;
    queryPoolCreateInfo.queryCount = 1;
    queryPoolCreateInfo.pipelineStatistics = 0;
    queryPoolCreateInfo.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
    queryPoolCreateInfo._4_4_ = 0;
    queryPoolCreateInfo.pNext = (void *)0x0;
    secBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)local_e8;
    ::vk::createQueryPool
              ((Move<vk::Handle<(vk::HandleType)11>_> *)&local_168,vk,device,&queryPoolCreateInfo,
               (VkAllocationCallbacks *)0x0);
    local_1a8.m_data.deleter.m_device = (VkDevice)local_168.field_2._M_allocated_capacity;
    local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_168.field_2._8_8_;
    local_1a8.m_data.object.m_internal = (deUint64)local_168._M_dataplus._M_p;
    local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_168._M_string_length;
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    local_168.field_2._8_8_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)11>_> *)&local_168);
    VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_188.m_data.object,&secBufferBeginInfo);
    ::vk::checkResult(VVar2,"vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb1e);
    VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_188.m_data.object);
    ::vk::checkResult(VVar2,"vk.endCommandBuffer(secCmdBuf.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb1f);
    VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_1c8.m_data.object,&primBufferBeginInfo);
    ::vk::checkResult(VVar2,"vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb21);
    (*vk->_vptr_DeviceInterface[0x70])
              (vk,local_1c8.m_data.object,local_1a8.m_data.object.m_internal,0,1);
    (*vk->_vptr_DeviceInterface[0x6e])
              (vk,local_1c8.m_data.object,local_1a8.m_data.object.m_internal,0,1);
    (*vk->_vptr_DeviceInterface[0x77])(vk,local_1c8.m_data.object,1);
    (*vk->_vptr_DeviceInterface[0x6f])
              (vk,local_1c8.m_data.object,local_1a8.m_data.object.m_internal,0);
    VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_1c8.m_data.object);
    ::vk::checkResult(VVar2,"vk.endCommandBuffer(primCmdBuf.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb2a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "Successfully recorded a secondary command buffer allowing a precise occlusion query."
               ,&local_1c9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase(&local_1a8);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_188);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_1c8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_148);
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Inherited queries feature is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
             ,0xad7);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus recordBufferQueryPreciseWithFlagTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	if (!context.getDeviceFeatures().inheritedQueries)
		TCU_THROW(NotSupportedError, "Inherited queries feature is not supported");

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		primCmdBufParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &primCmdBufParams));

	// Secondary Command buffer params
	const VkCommandBufferAllocateInfo		secCmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_SECONDARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			secCmdBuf				(allocateCommandBuffer(vk, vkDevice, &secCmdBufParams));

	const VkCommandBufferBeginInfo			primBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const VkCommandBufferInheritanceInfo	secBufferInheritInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		0u,															// renderPass
		0u,															// subpass
		0u,															// framebuffer
		VK_TRUE,													// occlusionQueryEnable
		VK_QUERY_CONTROL_PRECISE_BIT,								// queryFlags
		(VkQueryPipelineStatisticFlags)0u,							// pipelineStatistics
	};
	const VkCommandBufferBeginInfo			secBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		&secBufferInheritInfo,
	};

	const VkQueryPoolCreateInfo				queryPoolCreateInfo		=
	{
		VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		(VkQueryPoolCreateFlags)0,									// flags
		VK_QUERY_TYPE_OCCLUSION,									// queryType
		1u,															// entryCount
		0u,															// pipelineStatistics
	};
	Unique<VkQueryPool>						queryPool				(createQueryPool(vk, vkDevice, &queryPoolCreateInfo));

	VK_CHECK(vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo));
	VK_CHECK(vk.endCommandBuffer(secCmdBuf.get()));

	VK_CHECK(vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo));
	{
		vk.cmdResetQueryPool(primCmdBuf.get(), queryPool.get(), 0u, 1u);
		vk.cmdBeginQuery(primCmdBuf.get(), queryPool.get(), 0u, VK_QUERY_CONTROL_PRECISE_BIT);
		{
			vk.cmdExecuteCommands(primCmdBuf.get(), 1u, &secCmdBuf.get());
		}
		vk.cmdEndQuery(primCmdBuf.get(), queryPool.get(), 0u);
	}
	VK_CHECK(vk.endCommandBuffer(primCmdBuf.get()));

	return tcu::TestStatus::pass("Successfully recorded a secondary command buffer allowing a precise occlusion query.");
}